

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utScenePreprocessor.cpp
# Opt level: O0

void __thiscall
ScenePreprocessorTest_testAnimationPreprocessingPos_Test::TestBody
          (ScenePreprocessorTest_testAnimationPreprocessingPos_Test *this)

{
  double dVar1;
  aiNodeAnim *paVar2;
  bool bVar3;
  aiAnimation *anim_00;
  aiVectorKey *paVar4;
  char *pcVar5;
  char *in_R9;
  bool local_159;
  bool local_139;
  aiVectorKey *local_100;
  string local_f8;
  AssertHelper local_d8;
  Message local_d0;
  bool local_c1;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_90;
  Message local_88;
  aiVector3t<float> local_80;
  bool local_71;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_;
  Message local_58 [3];
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  float local_28;
  uint local_24;
  uint i;
  aiNodeAnim *anim;
  aiAnimation *p;
  ScenePreprocessorTest_testAnimationPreprocessingPos_Test *this_local;
  
  anim_00 = MakeDummyAnimation();
  paVar2 = *anim_00->mChannels;
  paVar2->mNumScalingKeys = 10;
  paVar4 = (aiVectorKey *)operator_new__(0xf0);
  local_100 = paVar4;
  do {
    aiVectorKey::aiVectorKey(local_100);
    local_100 = local_100 + 1;
  } while (local_100 != paVar4 + 10);
  paVar2->mScalingKeys = paVar4;
  for (local_24 = 0; local_24 < 10; local_24 = local_24 + 1) {
    paVar2->mScalingKeys[local_24].mTime = (double)local_24;
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)&gtest_ar.message_,(float)local_24);
    paVar4 = paVar2->mScalingKeys;
    *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&paVar4[local_24].mValue
         = gtest_ar.message_.ptr_;
    paVar4[local_24].mValue.z = local_28;
  }
  ScenePreprocessorTest::ProcessAnimation(&this->super_ScenePreprocessorTest,anim_00);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_40,"p->mDuration","9.","0.005",anim_00->mDuration,9.0,0.005);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar3) {
    testing::Message::Message(local_58);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utScenePreprocessor.cpp"
               ,0xbc,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  local_139 = false;
  if ((paVar2->mNumPositionKeys == 1) &&
     (local_139 = false, paVar2->mPositionKeys != (aiVectorKey *)0x0)) {
    dVar1 = paVar2->mPositionKeys->mTime;
    local_139 = false;
    if ((dVar1 == 0.0) && (!NAN(dVar1))) {
      paVar4 = paVar2->mPositionKeys;
      aiVector3t<float>::aiVector3t(&local_80,1.0,2.0,3.0);
      local_139 = aiVector3t<float>::operator==(&paVar4->mValue,&local_80);
    }
  }
  local_71 = local_139;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_70,&local_71,(type *)0x0)
  ;
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar3) {
    testing::Message::Message(&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_70,
               (AssertionResult *)
               "anim->mNumPositionKeys == 1 && anim->mPositionKeys && anim->mPositionKeys[0].mTime == 0.0 && anim->mPositionKeys[0].mValue == aiVector3D(1.f,2.f,3.f)"
               ,"false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utScenePreprocessor.cpp"
               ,0xc2,pcVar5);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  local_159 = false;
  if ((paVar2->mNumRotationKeys == 1) &&
     (local_159 = false, paVar2->mRotationKeys != (aiQuatKey *)0x0)) {
    local_159 = paVar2->mRotationKeys->mTime == 0.0;
  }
  local_c1 = local_159;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c0,&local_c1,(type *)0x0)
  ;
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar3) {
    testing::Message::Message(&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f8,(internal *)local_c0,
               (AssertionResult *)
               "anim->mNumRotationKeys == 1 && anim->mRotationKeys && anim->mRotationKeys[0].mTime == 0.0"
               ,"false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utScenePreprocessor.cpp"
               ,0xc6,pcVar5);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  if (anim_00 != (aiAnimation *)0x0) {
    aiAnimation::~aiAnimation(anim_00);
    operator_delete(anim_00);
  }
  return;
}

Assistant:

TEST_F(ScenePreprocessorTest, testAnimationPreprocessingPos) {
    aiAnimation* p = MakeDummyAnimation();
    aiNodeAnim* anim = p->mChannels[0];

    // we don't set the animation duration, but generate scaling channels
    anim->mNumScalingKeys = 10;
    anim->mScalingKeys = new aiVectorKey[10];

    for (unsigned int i = 0; i < 10;++i)    {
        anim->mScalingKeys[i].mTime = i;
        anim->mScalingKeys[i].mValue = aiVector3D((float)i);
    }
    ProcessAnimation(p);

    // we should now have a proper duration
    EXPECT_NEAR(p->mDuration, 9., 0.005);

    // ... one scaling key
    EXPECT_TRUE(anim->mNumPositionKeys == 1 &&
        anim->mPositionKeys &&
        anim->mPositionKeys[0].mTime == 0.0 &&
        anim->mPositionKeys[0].mValue == aiVector3D(1.f,2.f,3.f));

    // ... and one rotation key
    EXPECT_TRUE(anim->mNumRotationKeys == 1 && anim->mRotationKeys &&
        anim->mRotationKeys[0].mTime == 0.0);

    delete p;
}